

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::CommandLineInterface::MemoryOutputStream::InsertShiftedInfo
          (MemoryOutputStream *this,string *insertion_content,size_t insertion_offset,
          size_t indent_length,GeneratedCodeInfo *target_info)

{
  void **ppvVar1;
  Rep *pRVar2;
  GeneratedCodeInfo_Annotation *from;
  GeneratedCodeInfo_Annotation *this_00;
  void **ppvVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  
  lVar7 = insertion_offset + indent_length;
  pRVar2 = (this->info_to_insert_).annotation_.super_RepeatedPtrFieldBase.rep_;
  ppvVar3 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar3 = (void **)0x0;
  }
  ppvVar1 = ppvVar3 + (this->info_to_insert_).annotation_.super_RepeatedPtrFieldBase.current_size_;
  uVar6 = 0;
  for (; ppvVar3 != ppvVar1; ppvVar3 = ppvVar3 + 1) {
    from = (GeneratedCodeInfo_Annotation *)*ppvVar3;
    this_00 = RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation>::Add
                        (&target_info->annotation_);
    uVar4 = insertion_content->_M_string_length - 1;
    if ((ulong)(long)from->end_ < uVar4) {
      uVar4 = (long)from->end_;
    }
    uVar5 = 0;
    for (; uVar6 < uVar4; uVar6 = uVar6 + 1) {
      if ((insertion_content->_M_dataplus)._M_p[uVar6] == '\n') {
        if (uVar6 < (ulong)(long)from->begin_) {
          lVar7 = lVar7 + indent_length;
        }
        else {
          uVar5 = (ulong)(uint)((int)uVar5 + (int)indent_length);
        }
      }
    }
    GeneratedCodeInfo_Annotation::CopyFrom(this_00,from);
    this_00->begin_ = this_00->begin_ + (int)lVar7;
    lVar7 = lVar7 + uVar5;
    *(byte *)(this_00->_has_bits_).has_bits_ = (byte)(this_00->_has_bits_).has_bits_[0] | 6;
    this_00->end_ = this_00->end_ + (int)lVar7;
  }
  return;
}

Assistant:

void CommandLineInterface::MemoryOutputStream::InsertShiftedInfo(
    const std::string& insertion_content, size_t insertion_offset,
    size_t indent_length, google::protobuf::GeneratedCodeInfo& target_info) {
  // Keep track of how much extra data was added for indents before the
  // current annotation being inserted. `pos` and `source_annotation.begin()`
  // are offsets in `insertion_content`. `insertion_offset` is updated so that
  // it can be added to an annotation's `begin` field to reflect that
  // annotation's updated location after `insertion_content` was inserted into
  // the target file.
  size_t pos = 0;
  insertion_offset += indent_length;
  for (const auto& source_annotation : info_to_insert_.annotation()) {
    GeneratedCodeInfo::Annotation* annotation = target_info.add_annotation();
    int inner_indent = 0;
    // insertion_content is guaranteed to end in an endline. This last endline
    // has no effect on indentation.
    for (; pos < source_annotation.end() && pos < insertion_content.size() - 1;
         ++pos) {
      if (insertion_content[pos] == '\n') {
        if (pos >= source_annotation.begin()) {
          // The beginning of the annotation is at insertion_offset, but the end
          // can still move further in the target file.
          inner_indent += indent_length;
        } else {
          insertion_offset += indent_length;
        }
      }
    }
    *annotation = source_annotation;
    annotation->set_begin(annotation->begin() + insertion_offset);
    insertion_offset += inner_indent;
    annotation->set_end(annotation->end() + insertion_offset);
  }
}